

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void __thiscall fs::Path::Path(Path *this,string *path,string *separator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char *pcVar5;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->_complete).field_2;
  (this->_complete)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + path->_M_string_length);
  local_40 = &(this->_stem).field_2;
  (this->_stem)._M_dataplus._M_p = (pointer)local_40;
  (this->_stem)._M_string_length = 0;
  (this->_stem).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->_extension).field_2;
  (this->_extension)._M_dataplus._M_p = (pointer)local_48;
  (this->_extension)._M_string_length = 0;
  (this->_extension).field_2._M_local_buf[0] = '\0';
  local_50 = &(this->_file).field_2;
  (this->_file)._M_dataplus._M_p = (pointer)local_50;
  (this->_file)._M_string_length = 0;
  (this->_file).field_2._M_local_buf[0] = '\0';
  local_58 = &(this->_fullpath).field_2;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fullpath)._M_dataplus._M_p = (pointer)local_58;
  (this->_fullpath)._M_string_length = 0;
  (this->_fullpath).field_2._M_local_buf[0] = '\0';
  (this->_separator)._M_dataplus._M_p = (pointer)&(this->_separator).field_2;
  pcVar2 = (separator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_separator,pcVar2,pcVar2 + separator->_M_string_length);
  pcVar2 = (path->_M_dataplus)._M_p;
  pcVar3 = (separator->_M_dataplus)._M_p;
  _Var4 = std::
          __find_end<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pcVar2,pcVar2 + path->_M_string_length,pcVar3,
                     pcVar3 + separator->_M_string_length);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_78,(path->_M_dataplus)._M_p,_Var4._M_current);
  setPath(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (path->_M_dataplus)._M_p + path->_M_string_length;
  if (_Var4._M_current + (_Var4._M_current != pcVar5) == pcVar5) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    setFile(this,&local_78);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
    setFile(this,&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

fs::Path::Path(std::string const& path, std::string const& separator) :
    _complete(path),
    _separator(separator)
{
  auto sep_path = std::find_end(path.begin(), path.end(),
                                separator.begin(), separator.end());

  setPath( { path.begin(), sep_path });
  if (sep_path != path.end())
    ++sep_path;
  if (sep_path != path.end())
	  setFile({ sep_path, path.end() });
  else
	  setFile("");
}